

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertySingleValue::~IfcPropertySingleValue
          (IfcPropertySingleValue *this)

{
  undefined8 *puVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  lVar2 = *(long *)(*(long *)this + -0x18);
  puVar1 = (undefined8 *)(&this->field_0x0 + lVar2);
  *(undefined ***)(&this->field_0x0 + lVar2) = &PTR__IfcPropertySingleValue_0085a2e0;
  *(undefined ***)(&this->field_0xa8 + lVar2) = &PTR__IfcPropertySingleValue_0085a358;
  *(undefined ***)(&this->field_0x58 + lVar2) = &PTR__IfcPropertySingleValue_0085a308;
  *(undefined ***)
   ((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySingleValue,_2UL>).
           _vptr_ObjectHelper + lVar2) = &PTR__IfcPropertySingleValue_0085a330;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)&(this->Unit).ptr.
                     super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + lVar2);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[0x10] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[0x10]);
  }
  *puVar1 = 0x85a470;
  puVar1[0x15] = 0x85a498;
  if ((long *)puVar1[6] != puVar1 + 8) {
    operator_delete((long *)puVar1[6],puVar1[8] + 1);
  }
  if ((long *)puVar1[2] != puVar1 + 4) {
    operator_delete((long *)puVar1[2],puVar1[4] + 1);
  }
  operator_delete(puVar1,0xc0);
  return;
}

Assistant:

IfcPropertySingleValue() : Object("IfcPropertySingleValue") {}